

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pedestrian.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_9ea68::Pedestrian::annotatePathFollowing
          (Pedestrian *this,Vec3 *future,Vec3 *onPath,Vec3 *target,float outside)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  Color darkOrange;
  Color lightOrange;
  Color yellow;
  Color yellowOrange;
  Vec3 local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  float local_88;
  Color local_70;
  Color local_60;
  Color local_50;
  Color local_40;
  
  local_88 = outside;
  OpenSteer::Color::Color(&local_50,1.0,1.0,0.0,1.0);
  OpenSteer::Color::Color(&local_60,1.0,0.5,0.0,1.0);
  OpenSteer::Color::Color(&local_70,0.6,0.3,0.0,1.0);
  fVar9 = 0.75;
  OpenSteer::Color::Color(&local_40,1.0,0.75,0.0,1.0);
  local_b8._0_8_ = (**(code **)(*(long *)this + 0x40))(this);
  local_b8.z = fVar9;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_b8,future,&local_50);
  local_b8._0_8_ = (**(code **)(*(long *)this + 0x40))(this);
  local_b8.z = fVar9;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_b8,target,&local_40);
  uVar1 = onPath->x;
  uVar4 = onPath->y;
  uVar2 = future->x;
  uVar5 = future->y;
  fVar9 = onPath->z - future->z;
  auVar11._0_4_ = (float)uVar1 - (float)uVar2;
  auVar11._4_4_ = (float)uVar4 - (float)uVar5;
  auVar11._8_8_ = 0;
  fVar8 = fVar9 * fVar9 + auVar11._0_4_ * auVar11._0_4_ + auVar11._4_4_ * auVar11._4_4_;
  if (fVar8 < 0.0) {
    local_a8 = ZEXT416((uint)fVar9);
    local_98 = auVar11;
    fVar8 = sqrtf(fVar8);
    auVar11 = local_98;
    fVar9 = (float)local_a8._0_4_;
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  uVar10 = auVar11._0_8_;
  if (0.0 < fVar8) {
    auVar7._4_4_ = fVar8;
    auVar7._0_4_ = fVar8;
    auVar7._8_4_ = fVar8;
    auVar7._12_4_ = fVar8;
    auVar11 = divps(auVar11,auVar7);
    uVar10 = auVar11._0_8_;
  }
  uVar3 = future->x;
  uVar6 = future->y;
  local_b8.z = (float)(~-(uint)(0.0 < fVar8) & (uint)fVar9 |
                      (uint)(fVar9 / fVar8) & -(uint)(0.0 < fVar8)) * local_88 + future->z;
  local_b8.y = (float)uVar6 + local_88 * (float)((ulong)uVar10 >> 0x20);
  local_b8.x = (float)uVar3 + local_88 * (float)uVar10;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 onPath,&local_b8,&local_70);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_b8,future,&local_60);
  return;
}

Assistant:

void annotatePathFollowing (const Vec3& future,
                                    const Vec3& onPath,
                                    const Vec3& target,
                                    const float outside)
        {
            const Color yellow (1, 1, 0);
            const Color lightOrange (1.0f, 0.5f, 0.0f);
            const Color darkOrange  (0.6f, 0.3f, 0.0f);
            const Color yellowOrange (1.0f, 0.75f, 0.0f);

            // draw line from our position to our predicted future position
            annotationLine (position(), future, yellow);

            // draw line from our position to our steering target on the path
            annotationLine (position(), target, yellowOrange);

            // draw a two-toned line between the future test point and its
            // projection onto the path, the change from dark to light color
            // indicates the boundary of the tube.
            const Vec3 boundaryOffset = (onPath - future).normalize() * outside;
            const Vec3 onPathBoundary = future + boundaryOffset;
            annotationLine (onPath, onPathBoundary, darkOrange);
            annotationLine (onPathBoundary, future, lightOrange);
        }